

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pred_tests.cpp
# Opt level: O0

void __thiscall
iu_AssertionTest_x_iutest_x_VariadicPred_Test::Body
          (iu_AssertionTest_x_iutest_x_VariadicPred_Test *this)

{
  bool bVar1;
  char *pcVar2;
  int in_stack_fffffffffffff7d8;
  AssertionHelper local_7a8;
  Fixed local_778;
  undefined1 local_5f0 [8];
  AssertionResult iutest_ar_3;
  Fixed local_598;
  undefined1 local_410 [8];
  AssertionResult iutest_ar_2;
  Fixed local_3b8;
  undefined1 local_230 [8];
  AssertionResult iutest_ar_1;
  AssertionHelper local_200;
  Fixed local_1d0;
  undefined1 local_38 [8];
  AssertionResult iutest_ar;
  iu_AssertionTest_x_iutest_x_VariadicPred_Test *this_local;
  
  iutest_ar._32_8_ = this;
  iutest::detail::AlwaysZero();
  iutest::AssertPredVariadicHelper<bool(*)(int,int,int,int,int,int),int,int,int,int,int,int>
            ((AssertionResult *)local_38,(iutest *)"PredTest6","0, 1, 2, 3, 4, 5",(char *)PredTest6,
             (_func_bool_int_int_int_int_int_int *)0x0,1,2,3,4,5,in_stack_fffffffffffff7d8);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_38);
  if (!bVar1) {
    memset(&local_1d0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1d0);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_38);
    iutest::AssertionHelper::AssertionHelper
              (&local_200,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/pred_tests.cpp"
               ,0x45,pcVar2,kFatalFailure);
    iutest::AssertionHelper::operator=(&local_200,&local_1d0);
    iutest::AssertionHelper::~AssertionHelper(&local_200);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1d0);
  }
  iutest_ar_1._37_3_ = 0;
  iutest_ar_1._36_1_ = !bVar1;
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_38);
  if (iutest_ar_1._36_4_ == 0) {
    iutest::detail::AlwaysZero();
    iutest::AssertPredVariadicHelper<bool(*)(int,int,int,int,int,int),int,int,int,int,int,int>
              ((AssertionResult *)local_230,(iutest *)"PredTest6","0, 1, 2, 3, 4, 5",
               (char *)PredTest6,(_func_bool_int_int_int_int_int_int *)0x0,1,2,3,4,5,
               in_stack_fffffffffffff7d8);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_230);
    if (!bVar1) {
      memset(&local_3b8,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_3b8);
      pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_230);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)&iutest_ar_2.m_result,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/pred_tests.cpp"
                 ,0x46,pcVar2,kNonFatalFailure);
      iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_2.m_result,&local_3b8);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_2.m_result);
      iutest::AssertionHelper::Fixed::~Fixed(&local_3b8);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_230);
    iutest::detail::AlwaysZero();
    iutest::AssertPredVariadicHelper<bool(*)(int,int,int,int,int,int),int,int,int,int,int,int>
              ((AssertionResult *)local_410,(iutest *)"PredTest6","0, 1, 2, 3, 4, 5",
               (char *)PredTest6,(_func_bool_int_int_int_int_int_int *)0x0,1,2,3,4,5,
               in_stack_fffffffffffff7d8);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_410);
    if (!bVar1) {
      memset(&local_598,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_598);
      pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_410);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)&iutest_ar_3.m_result,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/pred_tests.cpp"
                 ,0x47,pcVar2,kWarning);
      iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_ar_3.m_result,&local_598);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_ar_3.m_result);
      iutest::AssertionHelper::Fixed::~Fixed(&local_598);
    }
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_410);
    iutest::detail::AlwaysZero();
    iutest::AssertPredVariadicHelper<bool(*)(int,int,int,int,int,int),int,int,int,int,int,int>
              ((AssertionResult *)local_5f0,(iutest *)"PredTest6","0, 1, 2, 3, 4, 5",
               (char *)PredTest6,(_func_bool_int_int_int_int_int_int *)0x0,1,2,3,4,5,
               in_stack_fffffffffffff7d8);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_5f0);
    if (!bVar1) {
      memset(&local_778,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_778);
      pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_5f0);
      iutest::AssertionHelper::AssertionHelper
                (&local_7a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/pred_tests.cpp"
                 ,0x48,pcVar2,kAssumeFailure);
      iutest::AssertionHelper::operator=(&local_7a8,&local_778);
      iutest::AssertionHelper::~AssertionHelper(&local_7a8);
      iutest::AssertionHelper::Fixed::~Fixed(&local_778);
    }
    iutest_ar_1._37_3_ = 0;
    iutest_ar_1._36_1_ = !bVar1;
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_5f0);
  }
  return;
}

Assistant:

IUTEST(AssertionTest, VariadicPred)
{
    IUTEST_ASSERT_PRED(PredTest6, 0, 1, 2, 3, 4, 5);
    IUTEST_EXPECT_PRED(PredTest6, 0, 1, 2, 3, 4, 5);
    IUTEST_INFORM_PRED(PredTest6, 0, 1, 2, 3, 4, 5);
    IUTEST_ASSUME_PRED(PredTest6, 0, 1, 2, 3, 4, 5);
}